

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_main.cpp
# Opt level: O1

void D_AddDirectory(TArray<FString,_FString> *wadfiles,char *dir)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t __n;
  void *handle;
  size_t sVar4;
  findstate_t findstate;
  char skindir [4096];
  char curdir [4096];
  findstate_t local_2040;
  char local_2028 [4096];
  char local_1028 [4096];
  
  pcVar3 = getcwd(local_1028,0x1000);
  if (pcVar3 != (char *)0x0) {
    __n = strlen((char *)wadfiles);
    memcpy(local_2028,wadfiles,__n);
    local_2028[__n] = '\0';
    sVar4 = __n;
    if (local_2028[__n - 1] == '/') {
      sVar4 = __n - 1;
      local_2028[__n - 1] = '\0';
    }
    iVar1 = chdir(local_2028);
    if (iVar1 == 0) {
      local_2028[sVar4] = '/';
      handle = I_FindFirst("*.wad",&local_2040);
      if (handle != (void *)0xffffffffffffffff) {
        do {
          uVar2 = I_FindAttr(&local_2040);
          if ((uVar2 & 8) == 0) {
            strcpy(local_2028 + sVar4 + 1,local_2040.namelist[local_2040.current]->d_name);
            D_AddFile(&allwads,local_2028,true,-1);
          }
          iVar1 = I_FindNext(handle,&local_2040);
        } while (iVar1 == 0);
        I_FindClose(handle);
      }
    }
    chdir(local_1028);
  }
  return;
}

Assistant:

static void D_AddDirectory (TArray<FString> &wadfiles, const char *dir)
{
	char curdir[PATH_MAX];

	if (getcwd (curdir, PATH_MAX))
	{
		char skindir[PATH_MAX];
		findstate_t findstate;
		void *handle;
		size_t stuffstart;

		stuffstart = strlen (dir);
		memcpy (skindir, dir, stuffstart*sizeof(*dir));
		skindir[stuffstart] = 0;

		if (skindir[stuffstart-1] == '/')
		{
			skindir[--stuffstart] = 0;
		}

		if (!chdir (skindir))
		{
			skindir[stuffstart++] = '/';
			if ((handle = I_FindFirst ("*.wad", &findstate)) != (void *)-1)
			{
				do
				{
					if (!(I_FindAttr (&findstate) & FA_DIREC))
					{
						strcpy (skindir + stuffstart, I_FindName (&findstate));
						D_AddFile (wadfiles, skindir);
					}
				} while (I_FindNext (handle, &findstate) == 0);
				I_FindClose (handle);
			}
		}
		chdir (curdir);
	}
}